

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O0

Box * libDAI::boundSumProd
                (Factor *psi,vector<libDAI::Box,_std::allocator<libDAI::Box>_> *incomingBoxes,
                VarSet *dest,bool independent,bool normed)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  Box *pBVar5;
  TFactor<double> *li;
  reference this;
  reference pvVar6;
  TProb<double> *pTVar7;
  VarSet *this_00;
  TFactor<double> *pTVar8;
  VarSet *in_RCX;
  vector<libDAI::Box,_std::allocator<libDAI::Box>_> *in_RDX;
  Box *in_RDI;
  byte in_R8B;
  byte in_R9B;
  Box prod;
  Prob image_ep;
  size_t k_3;
  Factor prd;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vi;
  size_t ep_li;
  Prob image_max;
  Prob image_min;
  multind ep_index;
  size_t k_2;
  vector<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
  ep;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ep_dims;
  size_t nrBoxes;
  size_t k_1;
  size_t l_1;
  size_t k;
  size_t l;
  vector<libDAI::Box,_std::allocator<libDAI::Box>_> uniqueBoxes;
  Box *in_stack_fffffffffffffb88;
  Box *in_stack_fffffffffffffb90;
  value_type *in_stack_fffffffffffffb98;
  TFactor<double> *in_stack_fffffffffffffba0;
  Box *pBVar9;
  VarSet *in_stack_fffffffffffffba8;
  TFactor<double> *in_stack_fffffffffffffbb0;
  VarSet *in_stack_fffffffffffffbb8;
  Box *in_stack_fffffffffffffbc0;
  VarSet *in_stack_fffffffffffffbc8;
  TProb<double> *a;
  Box *in_stack_fffffffffffffbd0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffbd8;
  multind *in_stack_fffffffffffffbe0;
  TFactor<double> *in_stack_fffffffffffffbe8;
  TFactor<double> *this_01;
  multind *this_02;
  Box *pBVar10;
  vector<libDAI::Box,_std::allocator<libDAI::Box>_> *in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffd17;
  VarSet *in_stack_fffffffffffffd18;
  Factor *in_stack_fffffffffffffd20;
  Box *in_stack_fffffffffffffd28;
  Box local_2c0;
  TFactor<double> local_240 [2];
  TFactor<double> *local_1b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_178;
  TProb<double> *local_160;
  TFactor<double> *local_c8;
  undefined1 local_b9 [33];
  undefined8 local_98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  TFactor<double> *local_78;
  Box *local_70;
  Box *local_68;
  ulong local_60;
  ulong local_58;
  vector<libDAI::Box,_std::allocator<libDAI::Box>_> local_40;
  byte local_22;
  byte local_21;
  vector<libDAI::Box,_std::allocator<libDAI::Box>_> *local_18;
  
  local_21 = in_R8B & 1;
  local_22 = in_R9B & 1;
  if (local_21 == 0) {
    pBVar9 = &local_2c0;
    boundProd(in_stack_fffffffffffffce8);
    this_00 = Box::vars(pBVar9);
    pTVar8 = (TFactor<double> *)VarSet::stateSpace(this_00);
    if (pTVar8 < (TFactor<double> *)0x11) {
      boundProd(in_stack_fffffffffffffce8);
      TFactor<double>::TFactor((TFactor<double> *)pBVar9,pTVar8);
      VarSet::VarSet(&in_stack_fffffffffffffb90->_vars,&in_stack_fffffffffffffb88->_vars);
      Box::boundSumProd(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
                        in_stack_fffffffffffffd18,(bool)in_stack_fffffffffffffd17);
      VarSet::~VarSet((VarSet *)0xb16f7d);
      TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffb90);
      Box::~Box(in_stack_fffffffffffffb90);
    }
    else {
      in_stack_fffffffffffffb90 =
           (Box *)std::operator<<((ostream *)&std::cout,
                                  "# Warning: calculating looser bound in the interest of computation time"
                                 );
      std::ostream::operator<<(in_stack_fffffffffffffb90,std::endl<char,std::char_traits<char>>);
      Box::Box(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    }
    Box::~Box(in_stack_fffffffffffffb90);
  }
  else {
    local_18 = in_RDX;
    std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::vector
              ((vector<libDAI::Box,_std::allocator<libDAI::Box>_> *)0xb164ae);
    std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::size(local_18);
    std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::reserve
              ((vector<libDAI::Box,_std::allocator<libDAI::Box>_> *)in_stack_fffffffffffffbd0,
               (size_type)in_stack_fffffffffffffbc8);
    for (local_58 = 0; uVar1 = local_58,
        sVar3 = std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::size(local_18),
        uVar1 < sVar3; local_58 = local_58 + 1) {
      for (local_60 = 0; uVar1 = local_60,
          sVar3 = std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::size(&local_40),
          uVar1 < sVar3; local_60 = local_60 + 1) {
        pvVar4 = std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::operator[]
                           (local_18,local_58);
        Box::vars(pvVar4);
        pvVar4 = std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::operator[]
                           (&local_40,local_60);
        Box::vars(pvVar4);
        bVar2 = operator==(&in_stack_fffffffffffffb90->_vars,&in_stack_fffffffffffffb88->_vars);
        if (bVar2) {
          std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::operator[](local_18,local_58);
          std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::operator[](&local_40,local_60);
          Box::operator*=(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
          break;
        }
      }
      uVar1 = local_60;
      sVar3 = std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::size(&local_40);
      if (uVar1 == sVar3) {
        std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::operator[](local_18,local_58);
        std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::push_back
                  ((vector<libDAI::Box,_std::allocator<libDAI::Box>_> *)in_stack_fffffffffffffba0,
                   in_stack_fffffffffffffb98);
      }
    }
    local_68 = (Box *)0x0;
    while (pBVar10 = local_68,
          pBVar5 = (Box *)std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::size(local_18),
          pBVar9 = local_68, pBVar10 < pBVar5) {
      do {
        local_70 = (Box *)((long)&(pBVar9->_vars)._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 1);
        pBVar10 = local_70;
        pBVar5 = (Box *)std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::size(local_18);
        pBVar9 = local_70;
      } while (pBVar10 < pBVar5);
      local_68 = (Box *)((long)&(local_68->_vars)._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start + 1);
    }
    li = (TFactor<double> *)std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::size(&local_40);
    local_98 = 0;
    this_02 = (multind *)(local_b9 + 0x20);
    local_78 = li;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xb167a7);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffbb0,
               (size_type)in_stack_fffffffffffffba8,
               (value_type_conflict2 *)in_stack_fffffffffffffba0,
               (allocator_type *)in_stack_fffffffffffffb98);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xb167d8);
    pTVar8 = (TFactor<double> *)local_b9;
    this_01 = local_78;
    std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>::
    allocator((allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>
               *)0xb167f7);
    std::
    vector<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
    ::vector((vector<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
              *)in_stack_fffffffffffffbb0,(size_type)in_stack_fffffffffffffba8,
             (allocator_type *)in_stack_fffffffffffffba0);
    std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>::
    ~allocator((allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>
                *)0xb1681d);
    for (local_c8 = (TFactor<double> *)0x0; local_c8 < local_78;
        local_c8 = (TFactor<double> *)
                   ((long)&(local_c8->_vs)._vars.
                           super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                           super__Vector_impl_data._M_start + 1)) {
      std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::operator[]
                (&local_40,(size_type)local_c8);
      Box::extremePoints(pBVar10);
      std::
      vector<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
      ::operator[]((vector<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
                    *)(local_b9 + 1),(size_type)local_c8);
      std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator=
                ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
                 in_stack_fffffffffffffba0,
                 (vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
                 in_stack_fffffffffffffb98);
      std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::~vector
                ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
                 in_stack_fffffffffffffba0);
      this = std::
             vector<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
             ::operator[]((vector<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
                           *)(local_b9 + 1),(size_type)local_c8);
      in_stack_fffffffffffffbe8 =
           (TFactor<double> *)
           std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::size(this);
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_90,(size_type)local_c8);
      *pvVar6 = (value_type)in_stack_fffffffffffffbe8;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&in_stack_fffffffffffffbe0->_dims,in_stack_fffffffffffffbd8);
    multind::multind(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffba0);
    VarSet::stateSpace(in_RCX);
    TProb<double>::TProb
              ((TProb<double> *)in_stack_fffffffffffffbd0,(size_t)in_stack_fffffffffffffbc8,
               (Real)in_stack_fffffffffffffbc0);
    VarSet::stateSpace(in_RCX);
    TProb<double>::TProb
              ((TProb<double> *)in_stack_fffffffffffffbd0,(size_t)in_stack_fffffffffffffbc8,
               (Real)in_stack_fffffffffffffbc0);
    local_160 = (TProb<double> *)0x0;
    while (a = local_160, pTVar7 = (TProb<double> *)multind::max((multind *)0xb16a16), a < pTVar7) {
      multind::vi(this_02,(size_t)li);
      TFactor<double>::TFactor(in_stack_fffffffffffffba0);
      for (local_1b8 = (TFactor<double> *)0x0; local_1b8 < local_78;
          local_1b8 = (TFactor<double> *)
                      ((long)&(local_1b8->_vs)._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start + 1)) {
        pvVar4 = std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::operator[]
                           (&local_40,(size_type)local_1b8);
        in_stack_fffffffffffffbc0 = (Box *)Box::vars(pvVar4);
        in_stack_fffffffffffffbb8 =
             (VarSet *)
             std::
             vector<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
             ::operator[]((vector<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
                           *)(local_b9 + 1),(size_type)local_1b8);
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_178,(size_type)local_1b8);
        std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator[]
                  ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)
                   in_stack_fffffffffffffbb8,*pvVar6);
        TFactor<double>::TFactor
                  (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                   (TProb<double> *)in_stack_fffffffffffffba0);
        TFactor<double>::operator*=(this_01,in_stack_fffffffffffffbe8);
        TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffb90);
      }
      TFactor<double>::operator*=(this_01,in_stack_fffffffffffffbe8);
      TFactor<double>::marginal
                (pTVar8,&this_01->_vs,SUB81((ulong)in_stack_fffffffffffffbe8 >> 0x38,0));
      in_stack_fffffffffffffbb0 = (TFactor<double> *)TFactor<double>::p(local_240);
      TProb<double>::TProb
                ((TProb<double> *)in_stack_fffffffffffffb90,
                 (TProb<double> *)in_stack_fffffffffffffb88);
      TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffb90);
      min<double>(a,(TProb<double> *)in_stack_fffffffffffffbc0);
      TProb<double>::operator=
                ((TProb<double> *)in_stack_fffffffffffffb90,
                 (TProb<double> *)in_stack_fffffffffffffb88);
      TProb<double>::~TProb((TProb<double> *)0xb16cb6);
      max<double>(a,(TProb<double> *)in_stack_fffffffffffffbc0);
      TProb<double>::operator=
                ((TProb<double> *)in_stack_fffffffffffffb90,
                 (TProb<double> *)in_stack_fffffffffffffb88);
      TProb<double>::~TProb((TProb<double> *)0xb16cf9);
      TProb<double>::~TProb((TProb<double> *)0xb16d06);
      TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffb90);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffba0)
      ;
      local_160 = (TProb<double> *)
                  ((long)&(local_160->_p).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start + 1);
    }
    Box::Box(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,(Prob *)in_stack_fffffffffffffbb0,
             (Prob *)in_stack_fffffffffffffba8);
    TProb<double>::~TProb((TProb<double> *)0xb16e13);
    TProb<double>::~TProb((TProb<double> *)0xb16e20);
    multind::~multind((multind *)in_stack_fffffffffffffb90);
    std::
    vector<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
    ::~vector((vector<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>,_std::allocator<std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>_>_>
               *)in_stack_fffffffffffffba0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffba0);
    std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::~vector
              ((vector<libDAI::Box,_std::allocator<libDAI::Box>_> *)in_stack_fffffffffffffba0);
  }
  return in_RDI;
}

Assistant:

Box boundSumProd( Factor psi, vector<Box> &incomingBoxes, VarSet dest, bool independent, bool normed ) {
        // Calculates a bounding box for the marginal or partial sum on dest
        // of the product of psi with all incoming boxes.
        //
        // If independent is true, each pair of incoming boxes hould either have
        // identical or disjoint varsets; furthermore, incoming boxes with disjoint
        // varsets are assumed to be independent.
        //
        // Otherwise, there is no restriction on the varsets of incoming boxes and
        // we assume that incoming boxes may be dependent.
        //
        // If normed is true, take the norm after taking the sum-product with psi

        if( independent ) {
            // Multiply together incoming boxes defined on the same variables
            vector<Box> uniqueBoxes;
            uniqueBoxes.reserve( incomingBoxes.size() );
            for( size_t l = 0; l < incomingBoxes.size(); l++ ) {
                size_t k = 0;
                for( k = 0; k < uniqueBoxes.size(); k++ )
                    if( incomingBoxes[l].vars() == uniqueBoxes[k].vars() ) {
                        uniqueBoxes[k] *= incomingBoxes[l];
                        break;
                    }
                if( k == uniqueBoxes.size() )
                    uniqueBoxes.push_back( incomingBoxes[l] );
            }

            // Check that all uniqueBoxes have disjoint sets of variables
            for( size_t l = 0; l < incomingBoxes.size(); l++ )
                for( size_t k = l + 1; k < incomingBoxes.size(); k++ )
                    assert( !(uniqueBoxes[k].vars() && uniqueBoxes[l].vars()) );

            size_t nrBoxes = uniqueBoxes.size();

            // Prepare multi-index to step through the Cartesian products of 
            // the extreme points corresponding to all disjoint varsets in
            // uniqueBoxes
            vector<size_t> ep_dims( nrBoxes, 0 );
            vector<vector<Prob> > ep( nrBoxes );
            for( size_t k = 0; k < nrBoxes; k++ ) {
                ep[k] = uniqueBoxes[k].extremePoints();
                ep_dims[k] = ep[k].size();
            }
            multind ep_index( ep_dims );

            // For each product of extreme points, calculate its image and
            // update the bound
            Prob image_min( dest.stateSpace(), INFINITY );
            Prob image_max( dest.stateSpace(), -INFINITY );
            for( size_t ep_li = 0; ep_li < ep_index.max(); ep_li++ ) {
                // FIXME: this can be sped up massively by caching the indices
                vector<size_t> vi = ep_index.vi( ep_li );
                Factor prd;
                for( size_t k = 0; k < nrBoxes; k++ )
                    prd *= Factor( uniqueBoxes[k].vars(), ep[k][vi[k]] );
                prd *= psi;
                Prob image_ep = prd.marginal(dest,normed).p();
                image_min = min( image_ep, image_min );
                image_max = max( image_ep, image_max );
            }
            return Box( dest, image_min, image_max );
        } else {
            Box prod = boundProd( incomingBoxes );
            if( prod.vars().stateSpace() <= 16 )
                return boundProd( incomingBoxes ).boundSumProd( psi, dest, normed );
            else {
                cout << "# Warning: calculating looser bound in the interest of computation time" << endl;
                return Box( dest );
            }
        }
    }